

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangemap.hh
# Opt level: O1

pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> __thiscall
rangemap<ScopeMapper>::find(rangemap<ScopeMapper> *this,linetype *point)

{
  _Rb_tree_header *p_Var1;
  AddrSpace *pAVar2;
  AddrSpace *pAVar3;
  bool bVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  _Base_ptr p_Var7;
  pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> pVar8;
  AddrRange addrend;
  AddrRange addrrange;
  AddrRange local_d0;
  AddrRange local_80;
  
  local_80.last.base = point->base;
  local_80.last.offset = point->offset;
  local_80.first.base = (AddrSpace *)0x0;
  local_80.a.base = (AddrSpace *)0x0;
  local_80.b.base = (AddrSpace *)0x0;
  local_80.value._M_node = (_List_node_base *)0x0;
  p_Var7 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->tree)._M_t._M_impl.super__Rb_tree_header;
  cVar6._M_node = &p_Var1->_M_header;
  if (p_Var7 != (_Base_ptr)0x0) {
    do {
      bVar4 = AddrRange::operator<((AddrRange *)(p_Var7 + 1),&local_80);
      if (!bVar4) {
        cVar6._M_node = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar4];
    } while (p_Var7 != (_Base_ptr)0x0);
  }
  cVar5._M_node = cVar6._M_node;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) goto LAB_0024e1b0;
  pAVar2 = point->base;
  pAVar3 = *(AddrSpace **)(cVar6._M_node + 1);
  if (pAVar2 == pAVar3) {
    bVar4 = (_Base_ptr)point->offset < cVar6._M_node[1]._M_parent;
LAB_0024e158:
    if (bVar4) goto LAB_0024e1b0;
  }
  else if (pAVar2 != (AddrSpace *)0xffffffffffffffff) {
    if ((pAVar2 == (AddrSpace *)0x0) || (pAVar3 == (AddrSpace *)0xffffffffffffffff))
    goto LAB_0024e1b0;
    if (pAVar3 != (AddrSpace *)0x0) {
      bVar4 = pAVar2->index < pAVar3->index;
      goto LAB_0024e158;
    }
  }
  local_d0.last.base = (AddrSpace *)cVar6._M_node[1]._M_left;
  local_d0.last.offset = (uintb)cVar6._M_node[1]._M_right;
  local_d0.first.base = (AddrSpace *)0x0;
  local_d0.a.base = (AddrSpace *)0x0;
  local_d0.b.base = (AddrSpace *)0x0;
  local_d0.value._M_node = (_List_node_base *)0x0;
  p_Var7 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cVar5._M_node = &p_Var1->_M_header;
  if (p_Var7 != (_Base_ptr)0x0) {
    do {
      bVar4 = AddrRange::operator<(&local_d0,(AddrRange *)(p_Var7 + 1));
      if (bVar4) {
        cVar5._M_node = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[!bVar4];
    } while (p_Var7 != (_Base_ptr)0x0);
  }
LAB_0024e1b0:
  pVar8.second.iter._M_node = (const_iterator)(const_iterator)cVar5._M_node;
  pVar8.first.iter._M_node = (const_iterator)(const_iterator)cVar6._M_node;
  return pVar8;
}

Assistant:

std::pair<typename rangemap<_recordtype>::const_iterator,typename rangemap<_recordtype>::const_iterator>
rangemap<_recordtype>::find(linetype point) const

{
  AddrRange addrrange(point);
  typename std::multiset<AddrRange>::const_iterator iter1,iter2;

  iter1 = tree.lower_bound(addrrange);
  // Check for no intersection
  if ((iter1==tree.end())||(point < (*iter1).first))
    return std::pair<PartIterator,PartIterator>(PartIterator(iter1),PartIterator(iter1));

  AddrRange addrend((*iter1).last,subsorttype(true));
  iter2 = tree.upper_bound(addrend);
    
  return std::pair<PartIterator,PartIterator>(PartIterator(iter1),PartIterator(iter2));
}